

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxel.h
# Opt level: O3

voxel __thiscall ocmesh::details::voxel::neighbor(voxel *this,face d)

{
  u16vec3 uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  undefined7 in_register_00000031;
  ushort uVar6;
  ushort uVar7;
  u16vec3 coordinates;
  undefined4 local_28;
  anon_union_2_3_4e909dac_for_tvec3<unsigned_short,_(glm::precision)0>_6 local_24;
  voxel local_20;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,d);
  uVar4 = 0;
  if (right < d) {
    uVar4 = ((d & ~right) != bottom) + 1;
  }
  uVar1 = voxel::coordinates(this);
  local_28 = uVar1._0_4_;
  local_24.z = uVar1.field_2;
  if ((uVar3 < 6) && ((0x2aU >> (uVar3 & 0x1f) & 1) != 0)) {
    uVar3 = (uint)this->_code;
    uVar5 = *(ushort *)((long)&local_28 + (ulong)uVar4 * 2);
    uVar2 = 1;
    uVar6 = (ushort)(1 << (0xd - ((byte)(uVar3 >> 0x15) & 0xf) & 0x1f));
    if (!CARRY2(uVar6,uVar5)) goto LAB_00104b2b;
    if ((d < (back|bottom)) && ((0x2aU >> (d & 0x1f) & 1) != 0)) {
      uVar2 = 0;
      goto LAB_00104b2b;
    }
  }
  else {
    uVar5 = *(ushort *)((long)&local_28 + (ulong)uVar4 * 2);
    uVar3 = (uint)this->_code;
    uVar6 = (ushort)(1 << (0xd - ((byte)(uVar3 >> 0x15) & 0xf) & 0x1f));
  }
  uVar2 = (ushort)(uVar5 != 0);
LAB_00104b2b:
  uVar7 = 0xffff;
  if ((d & ~bottom) == right) {
    uVar7 = uVar6;
  }
  if (d == front) {
    uVar7 = uVar6;
  }
  *(ushort *)((long)&local_28 + (ulong)uVar4 * 2) = uVar5 + uVar7 * uVar2;
  voxel(&local_20,
        (u16vec3)((uint6)(ushort)((short)local_28 * uVar2) |
                 (uint6)(ushort)(local_28._2_2_ * uVar2) << 0x10 |
                 (uint6)(ushort)(local_24.z * uVar2) << 0x20),(char)uVar2 * '\r',
        (uVar3 & 0x1fffff) * (uint)uVar2);
  return (voxel)local_20._code;
}

Assistant:

inline
voxel voxel::neighbor(face d) const
{
    /*
     * This will maybe be the most frequently called function in the entire
     * application, so we have to increase a bit its complexity to avoid
     * branches. Everything is computed in one linear flow control.
     */
    // First we choose if we need to add the size or subtract 1
    bool add_size = d == right  ||
                    d == top    ||
                    d == front;
    
    // Select the index of the coordinate to change.
    // Note: these ternary operators are probably not compiled as branches
    // TODO: Check the above statement
    uint8_t index = d == left || d == right  ? 0 :
                    d == top  || d == bottom ? 1 : 2 ;
    
    // Get the coordinates of the voxel
    glm::u16vec3 coordinates = this->coordinates();
    
    // Check if we have a neighbor at all
    uint16_t has_neighbor =
        (add_size && add_is_safe(coordinates[index], size())) ||
        (!add_size && coordinates[index] > 0);
    
    // We add the size if add_size is true,
    // or we add -1 if add_size is false,
    // but only if the neighbor actually exists
    coordinates[index] += has_neighbor * (add_size * size() - (!add_size));

    // Build the new voxel. If has_neighbor is false we obtain a void voxel.
    return voxel(has_neighbor * coordinates,
                 has_neighbor * max_level,
                 has_neighbor * material());
}